

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

Clause * __thiscall LinearGE<1,_0>::explain(LinearGE<1,_0> *this,Lit param_1,int inf_id)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Clause *this_00;
  Lit *pLVar5;
  size_t __size;
  long lVar6;
  ulong uVar7;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->x).sz;
  uVar2 = (this->y).sz;
  uVar4 = uVar2;
  if (uVar1 != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar3 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar6) + 0x48))();
      (this->ps).data[uVar7].x = iVar3;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (this->x).sz);
    uVar4 = (this->y).sz;
  }
  if (uVar4 == 0) {
    pLVar5 = (this->ps).data;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar3 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar6) + 0x40))();
      pLVar5 = (this->ps).data;
      pLVar5[(this->x).sz + (int)uVar7].x = iVar3;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (this->y).sz);
  }
  uVar7 = 0xffffffff;
  if (uVar2 + uVar1 != inf_id) {
    uVar7 = (ulong)(uint)inf_id;
  }
  pLVar5[uVar7].x = pLVar5->x;
  uVar1 = (this->ps).sz;
  __size = 8;
  if (uVar1 != 0) {
    __size = (ulong)(uVar1 - 1) * 4 + 8;
  }
  this_00 = (Clause *)malloc(__size);
  Clause::Clause<vec<Lit>>(this_00,&this->ps,false);
  *(byte *)this_00 = *(byte *)this_00 | 2;
  local_38 = this_00;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  return local_38;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}